

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

void __thiscall
HighsCliqueTable::extractCliques
          (HighsCliqueTable *this,HighsMipSolver *mipsolver,bool transformRows)

{
  ulong uVar1;
  HighsDomain *this_00;
  vector<double,_std::allocator<double>_> *pvVar2;
  double dVar3;
  HighsMipSolverData *pHVar4;
  HighsMipSolverData *pHVar5;
  ulong uVar6;
  bool bVar7;
  ValueType *pVVar8;
  vector<double,_std::allocator<double>_> *pvVar9;
  undefined7 in_register_00000011;
  HighsInt j_1;
  long lVar10;
  ulong in_R9;
  HighsInt j;
  int iVar11;
  long lVar12;
  HighsInt origin;
  long lVar13;
  u8 *rhs;
  HighsInt col_2;
  u8 *local_158;
  double local_150;
  HighsInt col_1;
  undefined4 uStack_144;
  HighsCliqueTable *local_140;
  vector<double,_std::allocator<double>_> *local_138;
  undefined4 local_12c;
  vector<signed_char,_std::allocator<signed_char>_> complementation;
  vector<double,_std::allocator<double>_> vals;
  vector<int,_std::allocator<int>_> inds;
  HighsInt col;
  undefined4 uStack_cc;
  u8 *local_c8;
  Entry *local_c0;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> clique;
  double offset;
  ulong local_78;
  HighsHashTable<int,_double> entries;
  vector<int,_std::allocator<int>_> perm;
  
  local_12c = (undefined4)CONCAT71(in_register_00000011,transformRows);
  inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clique.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  clique.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  clique.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_140 = this;
  HighsHashTable<int,_double>::HighsHashTable(&entries);
  pHVar4 = (mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  this_00 = &pHVar4->domain;
  pvVar2 = &(pHVar4->domain).col_upper_;
  local_138 = &(pHVar4->domain).col_lower_;
  local_78 = 0;
  do {
    while( true ) {
      uVar6 = local_78;
      if ((local_78 == (uint)mipsolver->model_->num_row_) ||
         (pHVar5 = (mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl,
         mipsolver->orig_model_->num_row_ <=
         *(int *)(*(long *)&(pHVar5->postSolveStack).origRowIndex.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl + local_78 * 4)))
      goto LAB_00278b53;
      lVar13 = *(long *)&(pHVar5->ARstart_).super__Vector_base<int,_std::allocator<int>_>._M_impl;
      lVar10 = (long)*(int *)(lVar13 + local_78 * 4);
      uVar1 = local_78 + 1;
      lVar13 = (long)*(int *)(lVar13 + 4 + local_78 * 4);
      dVar3 = (mipsolver->model_->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[local_78];
      origin = (HighsInt)local_78;
      local_78 = uVar1;
      if ((dVar3 == 1.0) && (!NAN(dVar3))) break;
LAB_00278517:
      if (((char)local_12c != '\0') && (local_140->numEntries < local_140->maxEntries)) {
        offset = 0.0;
        for (; dVar3 = offset, lVar13 != lVar10; lVar10 = lVar10 + 1) {
          pHVar5 = (mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
          _col_1 = (double)CONCAT44(uStack_144,
                                    *(undefined4 *)
                                     (*(long *)&(pHVar5->ARindex_).
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl + lVar10 * 4));
          _col = *(u8 **)(*(long *)&(pHVar5->ARvalue_).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl +
                         lVar10 * 8);
          resolveSubstitution(local_140,&col_1,(double *)&col,&offset);
          local_158 = _col;
          pVVar8 = HighsHashTable<int,_double>::operator[](&entries,&col_1);
          *pVVar8 = (double)local_158 + *pVVar8;
        }
        local_158 = (u8 *)(mipsolver->model_->row_upper_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar6];
        if ((double)local_158 < INFINITY) {
          if (inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish !=
              inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start) {
            inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
          }
          if (vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start) {
            vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_finish = vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
          }
          if (complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start) {
            complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          }
          HighsHashTable<int,_double>::begin((iterator *)&col,&entries);
          local_158 = (u8 *)((double)local_158 - dVar3);
          lVar13 = (long)entries.metadata._M_t.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                   entries.tableSizeMask;
          iVar11 = 0;
          while (_col != (u8 *)(lVar13 + 1)) {
            col_2 = local_c0[(long)_col - (long)local_c8].key_;
            _col_1 = local_c0[(long)_col - (long)local_c8].value_;
            if (((mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->epsilon <=
                ABS(_col_1)) {
              bVar7 = HighsDomain::isBinary(this_00,col_2);
              if (0.0 <= _col_1) {
                if (*(double *)
                     (*(long *)&(local_138->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl + (long)col_2 * 8) <= -INFINITY) goto LAB_002788b1;
                std::vector<double,_std::allocator<double>_>::push_back
                          (&vals,(value_type_conflict1 *)&col_1);
                std::vector<int,_std::allocator<int>_>::push_back(&inds,&col_2);
                local_150 = (double)CONCAT71(local_150._1_7_,1);
                std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                          (&complementation,(char *)&local_150);
                pvVar9 = local_138;
              }
              else {
                if (INFINITY <=
                    *(double *)
                     (*(long *)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl + (long)col_2 * 8)) goto LAB_002788b1;
                local_150 = -_col_1;
                std::vector<double,_std::allocator<double>_>::emplace_back<double>(&vals,&local_150)
                ;
                std::vector<int,_std::allocator<int>_>::push_back(&inds,&col_2);
                local_150 = (double)CONCAT71(local_150._1_7_,0xff);
                std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                          (&complementation,(char *)&local_150);
                pvVar9 = pvVar2;
              }
              iVar11 = iVar11 + (uint)bVar7;
              local_158 = (u8 *)((double)local_158 -
                                _col_1 * *(double *)
                                          (*(long *)&(pvVar9->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl + (long)col_2 * 8));
            }
            HighsHashTable<int,_double>::HashTableIterator<HighsHashTableEntry<int,_double>_>::
            operator++((HashTableIterator<HighsHashTableEntry<int,_double>_> *)&col);
          }
          if ((iVar11 != 0) &&
             (extractCliques(local_140,mipsolver,&inds,&vals,&complementation,(double)local_158,
                             (HighsInt)in_R9,&perm,&clique,
                             ((mipsolver->mipdata_)._M_t.
                              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                             feastol), (pHVar4->domain).infeasible_ != false)) goto LAB_00278b53;
        }
LAB_002788b1:
        dVar3 = (mipsolver->model_->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar6];
        if (-INFINITY < dVar3) {
          if (inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish !=
              inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start) {
            inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = inds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
          }
          if (vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start) {
            vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_finish = vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
          }
          if (complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start) {
            complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          }
          local_158 = (u8 *)offset;
          HighsHashTable<int,_double>::begin((iterator *)&col,&entries);
          lVar13 = (long)entries.metadata._M_t.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                   entries.tableSizeMask;
          iVar11 = 0;
          rhs = (u8 *)((double)local_158 - dVar3);
          while (_col != (u8 *)(lVar13 + 1)) {
            col_2 = local_c0[(long)_col - (long)local_c8].key_;
            _col_1 = -local_c0[(long)_col - (long)local_c8].value_;
            local_158 = rhs;
            if (((mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->epsilon <=
                ABS(local_c0[(long)_col - (long)local_c8].value_)) {
              bVar7 = HighsDomain::isBinary(this_00,col_2);
              if (0.0 <= _col_1) {
                if (*(double *)
                     (*(long *)&(local_138->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl + (long)col_2 * 8) <= -INFINITY) goto LAB_00278b41;
                std::vector<double,_std::allocator<double>_>::push_back
                          (&vals,(value_type_conflict1 *)&col_1);
                std::vector<int,_std::allocator<int>_>::push_back(&inds,&col_2);
                local_150 = (double)CONCAT71(local_150._1_7_,1);
                std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                          (&complementation,(char *)&local_150);
                pvVar9 = local_138;
              }
              else {
                if (INFINITY <=
                    *(double *)
                     (*(long *)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl + (long)col_2 * 8)) goto LAB_00278b41;
                local_150 = -_col_1;
                std::vector<double,_std::allocator<double>_>::emplace_back<double>(&vals,&local_150)
                ;
                std::vector<int,_std::allocator<int>_>::push_back(&inds,&col_2);
                local_150 = (double)CONCAT71(local_150._1_7_,0xff);
                std::vector<signed_char,_std::allocator<signed_char>_>::emplace_back<signed_char>
                          (&complementation,(char *)&local_150);
                pvVar9 = pvVar2;
              }
              iVar11 = iVar11 + (uint)bVar7;
              local_158 = (u8 *)((double)local_158 -
                                _col_1 * *(double *)
                                          (*(long *)&(pvVar9->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl + (long)col_2 * 8));
            }
            HighsHashTable<int,_double>::HashTableIterator<HighsHashTableEntry<int,_double>_>::
            operator++((HashTableIterator<HighsHashTableEntry<int,_double>_> *)&col);
            rhs = local_158;
          }
          if ((iVar11 != 0) &&
             (extractCliques(local_140,mipsolver,&inds,&vals,&complementation,(double)rhs,
                             (HighsInt)in_R9,&perm,&clique,
                             ((mipsolver->mipdata_)._M_t.
                              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                             feastol), (pHVar4->domain).infeasible_ != false)) goto LAB_00278b53;
        }
LAB_00278b41:
        HighsHashTable<int,_double>::clear(&entries);
      }
    }
    lVar12 = lVar10;
    if (clique.
        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        clique.
        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      clique.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           clique.
           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
           ._M_impl.super__Vector_impl_data._M_start;
    }
    for (; lVar13 != lVar12; lVar12 = lVar12 + 1) {
      iVar11 = *(int *)(*(long *)&(((mipsolver->mipdata_)._M_t.
                                    super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                    .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl
                                   )->ARindex_).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl + lVar12 * 4);
      _col = (u8 *)CONCAT44(uStack_cc,iVar11);
      dVar3 = *(double *)
               (*(long *)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl +
               (long)iVar11 * 8);
      if ((((dVar3 != 0.0) || (NAN(dVar3))) ||
          (dVar3 = *(double *)
                    (*(long *)&(local_138->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl + (long)iVar11 * 8), dVar3 != 0.0)) || (NAN(dVar3))) {
        bVar7 = HighsDomain::isBinary(this_00,iVar11);
        if (((!bVar7) ||
            (dVar3 = *(double *)
                      (*(long *)&(((mipsolver->mipdata_)._M_t.
                                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)
                                 ->ARvalue_).super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl + lVar12 * 8), dVar3 != 1.0)) || (NAN(dVar3)))
        goto LAB_00278517;
        _col_1 = (double)CONCAT44(uStack_144,1);
        std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
        emplace_back<int&,int>
                  ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                    *)&clique,&col,&col_1);
      }
    }
    in_R9 = uVar6 & 0xffffffff;
    addClique(local_140,mipsolver,
              clique.
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_start,
              (HighsInt)
              ((ulong)((long)clique.
                             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)clique.
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 2),
              (bool)(-((mipsolver->model_->row_lower_).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar6] == 1.0) & 1),origin);
  } while ((pHVar4->domain).infeasible_ == false);
LAB_00278b53:
  HighsHashTable<int,_double>::~HighsHashTable(&entries);
  std::_Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
  ~_Vector_base(&clique.
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               );
  std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
            (&complementation.super__Vector_base<signed_char,_std::allocator<signed_char>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&perm.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vals.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&inds.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void HighsCliqueTable::extractCliques(HighsMipSolver& mipsolver,
                                      bool transformRows) {
  std::vector<HighsInt> inds;
  std::vector<double> vals;
  std::vector<HighsInt> perm;
  std::vector<int8_t> complementation;
  std::vector<CliqueVar> clique;
  HighsHashTable<HighsInt, double> entries;
  double offset;

  double rhs;

  HighsDomain& globaldom = mipsolver.mipdata_->domain;

  for (HighsInt i = 0; i != mipsolver.numRow(); ++i) {
    HighsInt start = mipsolver.mipdata_->ARstart_[i];
    HighsInt end = mipsolver.mipdata_->ARstart_[i + 1];

    if (mipsolver.mipdata_->postSolveStack.getOrigRowIndex(i) >=
        mipsolver.orig_model_->num_row_)
      break;

    // catch set packing and partitioning constraints that already have the form
    // of a clique without transformations and add those cliques with the rows
    // being recorded
    if (mipsolver.rowUpper(i) == 1.0) {
      bool issetppc = true;

      clique.clear();

      for (HighsInt j = start; j != end; ++j) {
        HighsInt col = mipsolver.mipdata_->ARindex_[j];
        if (globaldom.col_upper_[col] == 0.0 &&
            globaldom.col_lower_[col] == 0.0)
          continue;
        if (!globaldom.isBinary(col)) {
          issetppc = false;
          break;
        }

        if (mipsolver.mipdata_->ARvalue_[j] != 1.0) {
          issetppc = false;
          break;
        }

        clique.emplace_back(col, 1);
      }

      if (issetppc) {
        bool equality = mipsolver.rowLower(i) == 1.0;
        addClique(mipsolver, clique.data(), clique.size(), equality, i);
        if (globaldom.infeasible()) return;
        continue;
      }
    }
    if (!transformRows || isFull()) continue;

    offset = 0;
    for (HighsInt j = start; j != end; ++j) {
      HighsInt col = mipsolver.mipdata_->ARindex_[j];
      double val = mipsolver.mipdata_->ARvalue_[j];

      resolveSubstitution(col, val, offset);
      entries[col] += val;
    }

    if (mipsolver.rowUpper(i) != kHighsInf) {
      rhs = mipsolver.rowUpper(i) - offset;
      inds.clear();
      vals.clear();
      complementation.clear();
      bool freevar = false;
      HighsInt nbin = 0;

      for (const auto& entry : entries) {
        HighsInt col = entry.key();
        double val = entry.value();

        if (std::abs(val) < mipsolver.mipdata_->epsilon) continue;

        if (globaldom.isBinary(col)) ++nbin;

        if (val < 0) {
          if (globaldom.col_upper_[col] == kHighsInf) {
            freevar = true;
            break;
          }

          vals.push_back(-val);
          inds.push_back(col);
          complementation.push_back(-1);
          rhs -= val * globaldom.col_upper_[col];
        } else {
          if (globaldom.col_lower_[col] == -kHighsInf) {
            freevar = true;
            break;
          }

          vals.push_back(val);
          inds.push_back(col);
          complementation.push_back(1);
          rhs -= val * globaldom.col_lower_[col];
        }
      }

      if (!freevar && nbin != 0) {
        // printf("extracting cliques from this row:\n");
        // printRow(globaldom, inds.data(), vals.data(), inds.size(),
        //         -kHighsInf, rhs);
        extractCliques(mipsolver, inds, vals, complementation, rhs, nbin, perm,
                       clique, mipsolver.mipdata_->feastol);
        if (globaldom.infeasible()) return;
      }
    }

    if (mipsolver.rowLower(i) != -kHighsInf) {
      rhs = -mipsolver.rowLower(i) + offset;
      inds.clear();
      vals.clear();
      complementation.clear();
      bool freevar = false;
      HighsInt nbin = 0;

      for (const auto& entry : entries) {
        HighsInt col = entry.key();
        double val = -entry.value();
        if (std::abs(val) < mipsolver.mipdata_->epsilon) continue;

        if (globaldom.isBinary(col)) ++nbin;

        if (val < 0) {
          if (globaldom.col_upper_[col] == kHighsInf) {
            freevar = true;
            break;
          }

          vals.push_back(-val);
          inds.push_back(col);
          complementation.push_back(-1);
          rhs -= val * globaldom.col_upper_[col];
        } else {
          if (globaldom.col_lower_[col] == -kHighsInf) {
            freevar = true;
            break;
          }

          vals.push_back(val);
          inds.push_back(col);
          complementation.push_back(1);
          rhs -= val * globaldom.col_lower_[col];
        }
      }

      if (!freevar && nbin != 0) {
        // printf("extracting cliques from this row:\n");
        // printRow(globaldom, inds.data(), vals.data(), inds.size(),
        //         -kHighsInf, rhs);
        extractCliques(mipsolver, inds, vals, complementation, rhs, nbin, perm,
                       clique, mipsolver.mipdata_->feastol);
        if (globaldom.infeasible()) return;
      }
    }

    entries.clear();
  }
}